

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

void xmlRelaxNGValidateProgressiveCallback
               (xmlRegExecCtxtPtr exec,xmlChar *token,void *transdata,void *inputdata)

{
  undefined4 uVar1;
  xmlNodePtr node;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  xmlRegExecCtxtPtr exec_00;
  xmlRelaxNGValidStatePtr pxVar6;
  long lVar7;
  char *__format;
  xmlRelaxNGStatesPtr states;
  long lVar8;
  
  if (inputdata == (void *)0x0) {
    fprintf(_stderr,"callback on %s missing context\n");
    return;
  }
  node = *(xmlNodePtr *)((long)inputdata + 0xa8);
  *(undefined4 *)((long)inputdata + 0xa0) = 1;
  if (transdata == (void *)0x0) {
    if (*token == '#') {
      return;
    }
    __format = "callback on %s missing define\n";
  }
  else {
    if (*transdata == 4) {
      if (node->type == XML_ELEMENT_NODE) {
        if (*(xmlRegexpPtr *)((long)transdata + 0x68) == (xmlRegexpPtr)0x0) {
          *(undefined4 *)((long)inputdata + 0xa0) = 0;
          *(void **)((long)inputdata + 0xb0) = transdata;
          return;
        }
        exec_00 = xmlRegNewExecCtxt(*(xmlRegexpPtr *)((long)transdata + 0x68),
                                    xmlRelaxNGValidateProgressiveCallback,inputdata);
        if (exec_00 != (xmlRegExecCtxtPtr)0x0) {
          xmlRelaxNGElemPush((xmlRelaxNGValidCtxtPtr)inputdata,exec_00);
          pxVar6 = xmlRelaxNGNewValidState((xmlRelaxNGValidCtxtPtr)inputdata,node);
          if (pxVar6 != (xmlRelaxNGValidStatePtr)0x0) {
            uVar2 = *(undefined8 *)((long)inputdata + 0x60);
            *(xmlRelaxNGValidStatePtr *)((long)inputdata + 0x60) = pxVar6;
            bVar4 = 1;
            if ((*(xmlRelaxNGDefinePtr_conflict *)((long)transdata + 0x48) !=
                 (xmlRelaxNGDefinePtr_conflict)0x0) &&
               (iVar5 = xmlRelaxNGValidateAttributeList
                                  ((xmlRelaxNGValidCtxtPtr)inputdata,
                                   *(xmlRelaxNGDefinePtr_conflict *)((long)transdata + 0x48)),
               iVar5 != 0)) {
              *(undefined4 *)((long)inputdata + 0xa0) = 0xffffffff;
              bVar4 = 0;
              xmlRelaxNGAddValidError
                        ((xmlRelaxNGValidCtxtPtr)inputdata,XML_RELAXNG_ERR_ATTRVALID,node->name,
                         (xmlChar *)0x0,0);
            }
            if (*(long *)((long)inputdata + 0x60) == 0) {
              if (*(long *)((long)inputdata + 0x68) != 0) {
                uVar1 = *(undefined4 *)((long)inputdata + 0x38);
                iVar5 = **(int **)((long)inputdata + 0x68);
                bVar3 = iVar5 < 1;
                if (iVar5 < 1) {
LAB_00175abb:
                  *(byte *)((long)inputdata + 0x38) = *(byte *)((long)inputdata + 0x38) | 1;
                  xmlRelaxNGLogBestError((xmlRelaxNGValidCtxtPtr)inputdata);
                }
                else {
                  lVar8 = **(long **)(*(int **)((long)inputdata + 0x68) + 2);
                  *(long *)((long)inputdata + 0x60) = lVar8;
                  *(undefined8 *)(lVar8 + 8) = 0;
                  iVar5 = xmlRelaxNGValidateElementEnd((xmlRelaxNGValidCtxtPtr)inputdata,0);
                  if (iVar5 != 0) {
                    lVar8 = 1;
                    do {
                      lVar7 = (long)**(int **)((long)inputdata + 0x68);
                      bVar3 = lVar7 <= lVar8;
                      if (lVar7 <= lVar8) goto LAB_00175abb;
                      lVar7 = *(long *)(*(long *)(*(int **)((long)inputdata + 0x68) + 2) + lVar8 * 8
                                       );
                      *(long *)((long)inputdata + 0x60) = lVar7;
                      *(undefined8 *)(lVar7 + 8) = 0;
                      iVar5 = xmlRelaxNGValidateElementEnd((xmlRelaxNGValidCtxtPtr)inputdata,0);
                      lVar8 = lVar8 + 1;
                    } while (iVar5 != 0);
                  }
                }
                states = *(xmlRelaxNGStatesPtr *)((long)inputdata + 0x68);
                if (0 < states->nbState) {
                  lVar8 = 0;
                  do {
                    xmlRelaxNGFreeValidState
                              ((xmlRelaxNGValidCtxtPtr)inputdata,states->tabState[lVar8]);
                    lVar8 = lVar8 + 1;
                    states = *(xmlRelaxNGStatesPtr *)((long)inputdata + 0x68);
                  } while (lVar8 < states->nbState);
                }
                xmlRelaxNGFreeStates((xmlRelaxNGValidCtxtPtr)inputdata,states);
                *(undefined8 *)((long)inputdata + 0x68) = 0;
                if ((bool)(bVar4 & bVar3)) {
                  *(undefined4 *)((long)inputdata + 0xa0) = 0xffffffff;
                }
                *(undefined4 *)((long)inputdata + 0x38) = uVar1;
              }
            }
            else {
              *(undefined8 *)(*(long *)((long)inputdata + 0x60) + 8) = 0;
              iVar5 = xmlRelaxNGValidateElementEnd((xmlRelaxNGValidCtxtPtr)inputdata,1);
              if (iVar5 != 0) {
                *(undefined4 *)((long)inputdata + 0xa0) = 0xffffffff;
              }
              xmlRelaxNGFreeValidState
                        ((xmlRelaxNGValidCtxtPtr)inputdata,
                         *(xmlRelaxNGValidStatePtr *)((long)inputdata + 0x60));
            }
            if ((*(int *)((long)inputdata + 0xa0) == -1) &&
               ((*(byte *)((long)inputdata + 0x38) & 1) == 0)) {
              xmlRelaxNGDumpValidError((xmlRelaxNGValidCtxtPtr)inputdata);
            }
            *(undefined8 *)((long)inputdata + 0x60) = uVar2;
            return;
          }
        }
      }
      else {
        xmlRelaxNGAddValidError
                  ((xmlRelaxNGValidCtxtPtr)inputdata,XML_RELAXNG_ERR_NOTELEM,(xmlChar *)0x0,
                   (xmlChar *)0x0,0);
        if ((*(byte *)((long)inputdata + 0x38) & 1) == 0) {
          xmlRelaxNGDumpValidError((xmlRelaxNGValidCtxtPtr)inputdata);
        }
      }
      goto LAB_001759c9;
    }
    __format = "callback on %s define is not element\n";
  }
  fprintf(_stderr,__format);
  if (*(int *)((long)inputdata + 0x44) == 0) {
    *(undefined4 *)((long)inputdata + 0x44) = 0x25;
  }
LAB_001759c9:
  *(undefined4 *)((long)inputdata + 0xa0) = 0xffffffff;
  return;
}

Assistant:

static void
xmlRelaxNGValidateProgressiveCallback(xmlRegExecCtxtPtr exec
                                      ATTRIBUTE_UNUSED,
                                      const xmlChar * token,
                                      void *transdata, void *inputdata)
{
    xmlRelaxNGValidCtxtPtr ctxt = (xmlRelaxNGValidCtxtPtr) inputdata;
    xmlRelaxNGDefinePtr define = (xmlRelaxNGDefinePtr) transdata;
    xmlRelaxNGValidStatePtr state, oldstate;
    xmlNodePtr node;
    int ret = 0, oldflags;

#ifdef DEBUG_PROGRESSIVE
    xmlGenericError(xmlGenericErrorContext,
                    "Progressive callback for: '%s'\n", token);
#endif
    if (ctxt == NULL) {
        fprintf(stderr, "callback on %s missing context\n", token);
        return;
    }
    node = ctxt->pnode;
    ctxt->pstate = 1;
    if (define == NULL) {
        if (token[0] == '#')
            return;
        fprintf(stderr, "callback on %s missing define\n", token);
        if ((ctxt != NULL) && (ctxt->errNo == XML_RELAXNG_OK))
            ctxt->errNo = XML_RELAXNG_ERR_INTERNAL;
        ctxt->pstate = -1;
        return;
    }
    if ((ctxt == NULL) || (define == NULL)) {
        fprintf(stderr, "callback on %s missing info\n", token);
        if ((ctxt != NULL) && (ctxt->errNo == XML_RELAXNG_OK))
            ctxt->errNo = XML_RELAXNG_ERR_INTERNAL;
        ctxt->pstate = -1;
        return;
    } else if (define->type != XML_RELAXNG_ELEMENT) {
        fprintf(stderr, "callback on %s define is not element\n", token);
        if (ctxt->errNo == XML_RELAXNG_OK)
            ctxt->errNo = XML_RELAXNG_ERR_INTERNAL;
        ctxt->pstate = -1;
        return;
    }
    if (node->type != XML_ELEMENT_NODE) {
        VALID_ERR(XML_RELAXNG_ERR_NOTELEM);
        if ((ctxt->flags & FLAGS_IGNORABLE) == 0)
            xmlRelaxNGDumpValidError(ctxt);
        ctxt->pstate = -1;
        return;
    }
    if (define->contModel == NULL) {
        /*
         * this node cannot be validated in a streamable fashion
         */
#ifdef DEBUG_PROGRESSIVE
        xmlGenericError(xmlGenericErrorContext,
                        "Element '%s' validation is not streamable\n",
                        token);
#endif
        ctxt->pstate = 0;
        ctxt->pdef = define;
        return;
    }
    exec = xmlRegNewExecCtxt(define->contModel,
                             xmlRelaxNGValidateProgressiveCallback, ctxt);
    if (exec == NULL) {
        ctxt->pstate = -1;
        return;
    }
    xmlRelaxNGElemPush(ctxt, exec);

    /*
     * Validate the attributes part of the content.
     */
    state = xmlRelaxNGNewValidState(ctxt, node);
    if (state == NULL) {
        ctxt->pstate = -1;
        return;
    }
    oldstate = ctxt->state;
    ctxt->state = state;
    if (define->attrs != NULL) {
        ret = xmlRelaxNGValidateAttributeList(ctxt, define->attrs);
        if (ret != 0) {
            ctxt->pstate = -1;
            VALID_ERR2(XML_RELAXNG_ERR_ATTRVALID, node->name);
        }
    }
    if (ctxt->state != NULL) {
        ctxt->state->seq = NULL;
        ret = xmlRelaxNGValidateElementEnd(ctxt, 1);
        if (ret != 0) {
            ctxt->pstate = -1;
        }
        xmlRelaxNGFreeValidState(ctxt, ctxt->state);
    } else if (ctxt->states != NULL) {
        int tmp = -1, i;

        oldflags = ctxt->flags;

        for (i = 0; i < ctxt->states->nbState; i++) {
            state = ctxt->states->tabState[i];
            ctxt->state = state;
            ctxt->state->seq = NULL;

            if (xmlRelaxNGValidateElementEnd(ctxt, 0) == 0) {
                tmp = 0;
                break;
            }
        }
        if (tmp != 0) {
            /*
             * validation error, log the message for the "best" one
             */
            ctxt->flags |= FLAGS_IGNORABLE;
            xmlRelaxNGLogBestError(ctxt);
        }
        for (i = 0; i < ctxt->states->nbState; i++) {
            xmlRelaxNGFreeValidState(ctxt, ctxt->states->tabState[i]);
        }
        xmlRelaxNGFreeStates(ctxt, ctxt->states);
        ctxt->states = NULL;
        if ((ret == 0) && (tmp == -1))
            ctxt->pstate = -1;
        ctxt->flags = oldflags;
    }
    if (ctxt->pstate == -1) {
        if ((ctxt->flags & FLAGS_IGNORABLE) == 0) {
            xmlRelaxNGDumpValidError(ctxt);
        }
    }
    ctxt->state = oldstate;
}